

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_control_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_17bc3e0::LFControlEndToEndTestThreaded_EndtoEndPSNRTest_Test::TestBody
          (LFControlEndToEndTestThreaded_EndtoEndPSNRTest_Test *this)

{
  EncoderTest *pEVar1;
  int *__k;
  aom_bit_depth_t aVar2;
  uint uVar3;
  _func_int ***ppp_Var4;
  bool bVar5;
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> this_00;
  _Map_base<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  mapped_type *pmVar6;
  undefined8 *puVar7;
  SEARCH_METHODS *pSVar8;
  allocator aStack_79;
  AssertHelper AStack_78;
  undefined8 *puStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> _Stack_48;
  AssertHelper AStack_40;
  AssertHelper AStack_38;
  AssertHelperData *pAStack_30;
  uint uStack_24;
  
  (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.super_EncoderTest.cfg_.
  rc_target_bitrate = 500;
  (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.super_EncoderTest.cfg_.
  g_error_resilient = 0;
  (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.super_EncoderTest.cfg_.
  g_profile = (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.
              test_video_param_.profile;
  aVar2 = (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.test_video_param_.
          bit_depth;
  (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.super_EncoderTest.cfg_.
  g_input_bit_depth =
       (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.test_video_param_.
       input_bit_depth;
  (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.super_EncoderTest.cfg_.
  g_bit_depth = aVar2;
  (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.super_EncoderTest.
  init_flags_ = (ulong)(8 < (int)aVar2) << 0x12 | 0x10000;
  _Stack_48._M_head_impl = (VideoSource *)0x0;
  this_00._M_head_impl = (VideoSource *)operator_new(0xd8);
  std::__cxx11::string::string
            ((string *)auStack_68,
             (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.
             test_video_param_.filename,(allocator *)&AStack_78);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            ((Y4mVideoSource *)this_00._M_head_impl,(string *)auStack_68,0,10);
  if (_Stack_48._M_head_impl != (VideoSource *)0x0) {
    ppp_Var4 = &(_Stack_48._M_head_impl)->_vptr_VideoSource;
    _Stack_48._M_head_impl = this_00._M_head_impl;
    (*(*ppp_Var4)[1])();
    this_00._M_head_impl = _Stack_48._M_head_impl;
  }
  _Stack_48._M_head_impl = this_00._M_head_impl;
  if ((undefined1 *)CONCAT71(auStack_68._1_7_,auStack_68[0]) != auStack_58) {
    operator_delete((undefined1 *)CONCAT71(auStack_68._1_7_,auStack_68[0]));
  }
  AStack_78.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>,decltype(nullptr)>
            ((internal *)auStack_68,"video","nullptr",
             (unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> *
             )&_Stack_48,&AStack_78.data_);
  if (auStack_68[0] == (string)0x0) {
    testing::Message::Message((Message *)&AStack_78);
    if ((undefined8 *)CONCAT71(auStack_68._9_7_,auStack_68[8]) == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = *(SEARCH_METHODS **)CONCAT71(auStack_68._9_7_,auStack_68[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/loopfilter_control_test.cc"
               ,0x96,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&AStack_40,(Message *)&AStack_78);
    testing::internal::AssertHelper::~AssertHelper(&AStack_40);
    if (AStack_78.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AStack_78.data_ + 8))();
    }
    puVar7 = (undefined8 *)CONCAT71(auStack_68._9_7_,auStack_68[8]);
LAB_00648ff1:
    if (puVar7 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar7 != puVar7 + 2) {
        operator_delete((undefined8 *)*puVar7);
      }
      operator_delete(puVar7);
    }
  }
  else {
    puVar7 = (undefined8 *)CONCAT71(auStack_68._9_7_,auStack_68[8]);
    if (puVar7 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar7 != puVar7 + 2) {
        operator_delete((undefined8 *)*puVar7);
      }
      operator_delete(puVar7);
    }
    bVar5 = testing::internal::AlwaysTrue();
    if (bVar5) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)auStack_68);
      bVar5 = testing::internal::AlwaysTrue();
      if (bVar5) {
        pEVar1 = &(this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.
                  super_EncoderTest;
        (*pEVar1->_vptr_EncoderTest[2])(pEVar1,_Stack_48._M_head_impl);
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)auStack_68);
      if (auStack_68[8] == false) {
        uVar3 = (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.nframes_;
        AStack_40.data_ = (AssertHelperData *)0x0;
        if (uVar3 != 0) {
          AStack_40.data_ =
               (AssertHelperData *)
               ((this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.psnr_ /
               (double)uVar3);
        }
        std::__cxx11::string::string
                  ((string *)auStack_68,
                   (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.
                   test_video_param_.filename,&aStack_79);
        this_01 = (_Map_base<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)(anonymous_namespace)::kPsnrThreshold_abi_cxx11_,
                                  (key_type *)auStack_68);
        __k = &(this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.lf_control_;
        this_02 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](this_01,__k);
        uStack_24 = (this->super_LFControlEndToEndTestThreaded).super_LFControlEndToEndTest.aq_mode_
        ;
        pmVar6 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](this_02,(key_type *)&uStack_24);
        AStack_38.data_ = (AssertHelperData *)*pmVar6;
        if ((undefined1 *)CONCAT71(auStack_68._1_7_,auStack_68[0]) != auStack_58) {
          pAStack_30 = (AssertHelperData *)*pmVar6;
          operator_delete((undefined1 *)CONCAT71(auStack_68._1_7_,auStack_68[0]));
          AStack_38.data_ = pAStack_30;
        }
        testing::internal::CmpHelperGT<double,double>
                  ((internal *)&AStack_78,"psnr","GetPsnrThreshold()",(double *)&AStack_40,
                   (double *)&AStack_38);
        puVar7 = puStack_70;
        if (AStack_78.data_._0_1_ == (allocator)0x0) {
          testing::Message::Message((Message *)auStack_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT71(auStack_68._1_7_,auStack_68[0]) + 0x10),
                     "loopfilter control = ",0x15);
          std::ostream::operator<<((void *)(CONCAT71(auStack_68._1_7_,auStack_68[0]) + 0x10),*__k);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT71(auStack_68._1_7_,auStack_68[0]) + 0x10)," aq mode = ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>(CONCAT71(auStack_68._1_7_,auStack_68[0]) + 0x10);
          if (puStack_70 == (undefined8 *)0x0) {
            pSVar8 = "";
          }
          else {
            pSVar8 = (SEARCH_METHODS *)*puStack_70;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/loopfilter_control_test.cc"
                     ,0x9a,(char *)pSVar8);
          testing::internal::AssertHelper::operator=(&AStack_38,(Message *)auStack_68);
          testing::internal::AssertHelper::~AssertHelper(&AStack_38);
          puVar7 = puStack_70;
          if ((long *)CONCAT71(auStack_68._1_7_,auStack_68[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(auStack_68._1_7_,auStack_68[0]) + 8))();
            puVar7 = puStack_70;
          }
        }
        goto LAB_00648ff1;
      }
    }
    testing::Message::Message((Message *)auStack_68);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/loopfilter_control_test.cc"
               ,0x98,
               "Expected: RunLoop(video.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)auStack_68);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    if ((long *)CONCAT71(auStack_68._1_7_,auStack_68[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(auStack_68._1_7_,auStack_68[0]) + 8))();
    }
  }
  if ((Y4mVideoSource *)_Stack_48._M_head_impl != (Y4mVideoSource *)0x0) {
    (*((VideoSource *)&(_Stack_48._M_head_impl)->_vptr_VideoSource)->_vptr_VideoSource[1])();
  }
  return;
}

Assistant:

TEST(LFControlGetterTest, NullptrInput) {
  int *lf_level = nullptr;
  aom_codec_ctx_t encoder;
  aom_codec_enc_cfg_t cfg;
  aom_codec_enc_config_default(aom_codec_av1_cx(), &cfg, 1);
  EXPECT_EQ(aom_codec_enc_init(&encoder, aom_codec_av1_cx(), &cfg, 0),
            AOM_CODEC_OK);
  EXPECT_EQ(aom_codec_control(&encoder, AOME_GET_LOOPFILTER_LEVEL, lf_level),
            AOM_CODEC_INVALID_PARAM);
  EXPECT_EQ(aom_codec_destroy(&encoder), AOM_CODEC_OK);
}